

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O2

bool __thiscall
Minisat::OnlineProofChecker::removeClause<Minisat::Clause>(OnlineProofChecker *this,Clause *cls)

{
  int *piVar1;
  ClauseAllocator *this_00;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  Lit *pLVar5;
  pointer pvVar6;
  uint *puVar7;
  pointer pvVar8;
  long lVar9;
  uint uVar10;
  ostream *poVar11;
  pointer puVar12;
  bool bVar13;
  pointer puVar14;
  ulong uVar15;
  int i;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  size_t k;
  long lVar19;
  long lVar20;
  bool bVar21;
  Lit local_4c;
  Lit local_48;
  Lit smallest;
  
  if (3 < this->verbose) {
    poVar11 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] remove clause ");
    poVar11 = operator<<(poVar11,cls);
    std::endl<char,std::char_traits<char>>(poVar11);
    printState(this);
  }
  bVar13 = true;
  if (((ulong)cls->header >> 0x22 != 0) && (this->ok == true)) {
    if (((ulong)cls->header & 0xfffffffc00000000) == 0x400000000) {
      uVar10 = (this->unitClauses).sz;
      pLVar5 = (this->unitClauses).data;
      uVar15 = 0;
      uVar16 = 0;
      if (0 < (int)uVar10) {
        uVar15 = (ulong)uVar10;
      }
      do {
        uVar18 = uVar16;
        if (uVar15 == uVar18) goto LAB_001246b0;
        uVar16 = uVar18 + 1;
      } while (pLVar5[uVar18].x != *(int *)&cls[1].header);
      pLVar5[uVar18].x = pLVar5[(long)(int)uVar10 + -1].x;
      piVar1 = &(this->unitClauses).sz;
      *piVar1 = *piVar1 + -1;
      if (1 < this->verbose) {
        poVar11 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] removed clause ");
        poVar11 = operator<<(poVar11,cls);
        std::endl<char,std::char_traits<char>>(poVar11);
      }
    }
    else {
      MarkArray::nextStep(&this->ma);
      uVar2 = (this->ma).step;
      puVar12 = (this->ma).array.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar12[*(uint *)&cls[1].header] = uVar2;
      pvVar6 = (this->occ).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = 0;
      uVar16 = 1;
      while( true ) {
        uVar15 = (ulong)cls->header >> 0x22;
        lVar17 = (long)(int)uVar10;
        if (uVar15 <= uVar16) break;
        puVar12[*(uint *)(&cls[1].header.field_0x0 + uVar16 * 4)] = uVar2;
        iVar3 = *(int *)(&cls[1].header.field_0x0 + uVar16 * 4);
        uVar4 = (uint)uVar16;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar6[lVar17].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data + 8) -
                   *(long *)&pvVar6[lVar17].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data) <=
            (ulong)((long)*(pointer *)
                           ((long)&pvVar6[iVar3].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data + 8) -
                   *(long *)&pvVar6[iVar3].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data)) {
          uVar4 = uVar10;
        }
        uVar10 = uVar4;
        uVar16 = uVar16 + 1;
      }
      smallest.x = *(int *)(&cls[1].header.field_0x0 + lVar17 * 4);
      lVar17 = *(long *)&pvVar6[smallest.x].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data;
      puVar14 = *(pointer *)
                 ((long)&pvVar6[smallest.x].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data + 8);
      lVar20 = (long)puVar14 - lVar17;
      this_00 = &this->ca;
      puVar7 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
      for (lVar19 = 0; lVar19 != lVar20 >> 2; lVar19 = lVar19 + 1) {
        uVar4 = *(uint *)(lVar17 + lVar19 * 4);
        uVar16 = *(ulong *)(puVar7 + uVar4) >> 0x22;
        if (uVar16 == uVar15) {
          uVar18 = 0;
          do {
            if (uVar16 == uVar18) {
              *(undefined4 *)(lVar17 + lVar19 * 4) = *(undefined4 *)(lVar17 + -4 + lVar20);
              puVar14 = puVar14 + -1;
              *(pointer *)
               ((long)&pvVar6[smallest.x].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data + 8) = puVar14;
              bVar21 = (long)puVar14 - lVar17 != -4;
              bVar13 = uVar4 != 0xffffffff && bVar21;
              if (uVar4 == 0xffffffff || !bVar21) goto LAB_00124657;
              uVar16 = 0;
              goto LAB_001244e7;
            }
            lVar9 = uVar18 + 2;
            uVar18 = uVar18 + 1;
          } while (puVar12[puVar7[(ulong)uVar4 + lVar9]] == uVar2);
        }
      }
LAB_00124657:
      if (1 < this->verbose) {
        poVar11 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] could not remove clause ");
        poVar11 = operator<<(poVar11,cls);
        poVar11 = std::operator<<(poVar11," from list of literal ");
        poVar11 = operator<<(poVar11,&smallest);
        std::endl<char,std::char_traits<char>>(poVar11);
      }
      printState(this);
LAB_001246b0:
      bVar13 = false;
    }
  }
  return bVar13;
LAB_001244e7:
  if ((ulong)cls->header >> 0x22 <= uVar16) {
    detachClause(this,uVar4);
    puVar7 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
    *(ulong *)(puVar7 + uVar4) = (*(ulong *)(puVar7 + uVar4) & 0xfffffffffffffffc) + 1;
    ClauseAllocator::free(this_00,(void *)(ulong)uVar4);
    if (this->verbose < 2) {
      return bVar13;
    }
    poVar11 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] removed clause ");
    poVar11 = operator<<(poVar11,cls);
    poVar11 = std::operator<<(poVar11," which is internally ");
    poVar11 = operator<<(poVar11,(Clause *)
                                 ((this_00->super_RegionAllocator<unsigned_int>).memory + uVar4));
    std::endl<char,std::char_traits<char>>(poVar11);
    return bVar13;
  }
  if (uVar16 != uVar10) {
    iVar3 = *(int *)(&cls[1].header.field_0x0 + uVar16 * 4);
    pvVar8 = (this->occ).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = pvVar8 + iVar3;
    lVar17 = *(long *)&pvVar8[iVar3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data;
    puVar12 = *(pointer *)
               ((long)&pvVar8[iVar3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data + 8);
    lVar19 = (long)puVar12 - lVar17;
    for (lVar20 = 0; lVar19 >> 2 != lVar20; lVar20 = lVar20 + 1) {
      if (*(uint *)(lVar17 + lVar20 * 4) == uVar4) {
        *(undefined4 *)(lVar17 + lVar20 * 4) = *(undefined4 *)(lVar17 + -4 + lVar19);
        puVar12 = puVar12 + -1;
        *(pointer *)
         ((long)&(pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data + 8) = puVar12;
        if ((long)puVar12 - lVar17 != -4) goto LAB_0012464f;
        break;
      }
    }
    if (1 < this->verbose) {
      poVar11 = std::operator<<((ostream *)&std::cerr,"c could not remove clause ");
      poVar11 = operator<<(poVar11,cls);
      poVar11 = std::operator<<(poVar11," from list of literal ");
      local_48.x = *(int *)(&cls[1].header.field_0x0 + uVar16 * 4);
      poVar11 = operator<<(poVar11,&local_48);
      std::endl<char,std::char_traits<char>>(poVar11);
    }
    printState(this);
    if (2 < this->verbose) {
      poVar11 = std::operator<<((ostream *)&std::cerr,"c list for ");
      local_4c.x = *(int *)(&cls[1].header.field_0x0 + uVar16 * 4);
      poVar11 = operator<<(poVar11,&local_4c);
      std::operator<<(poVar11," : ");
      for (uVar15 = 0;
          uVar15 < (ulong)((long)*(pointer *)
                                  ((long)&(pvVar6->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data + 8) -
                           *(long *)&(pvVar6->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data >> 2); uVar15 = uVar15 + 1) {
        poVar11 = std::operator<<((ostream *)&std::cerr,"c ");
        poVar11 = operator<<(poVar11,(Clause *)
                                     ((this_00->super_RegionAllocator<unsigned_int>).memory +
                                     *(uint *)(*(long *)&(pvVar6->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data + uVar15 * 4)));
        std::endl<char,std::char_traits<char>>(poVar11);
      }
    }
  }
LAB_0012464f:
  uVar16 = uVar16 + 1;
  goto LAB_001244e7;
}

Assistant:

inline bool OnlineProofChecker::removeClause(const T &cls)
{
    if (verbose > 3) {
        std::cerr << "c [DRAT-OTFC] remove clause " << cls << std::endl;
        printState();
    }

    if (cls.size() == 0 || !ok) {
        return true;
    } // do not handle empty clauses here!
    if (cls.size() == 1) {
        const Lit l = cls[0];
        int i = 0;
        bool found = false;
        for (; i < unitClauses.size(); ++i) {
            if (unitClauses[i] == l) {
                unitClauses[i] = unitClauses[unitClauses.size() - 1];
                unitClauses.pop();
                found = true;
                break; // remove only once!
            }
        }
        if (!found) {
            assert(false && "the unit clause should be inside the vector of units");
            return false;
        }
        if (verbose > 1) {
            std::cerr << "c [DRAT-OTFC] removed clause " << cls << std::endl;
        }
        return true;
    }
    // find correct CRef ...
    ma.nextStep();
    int smallestIndex = 0;
    ma.setCurrentStep(toInt(cls[0]));
    for (int i = 1; i < cls.size(); ++i) {
        ma.setCurrentStep(toInt(cls[i]));
        if (occ[toInt(cls[i])].size() < occ[smallestIndex].size()) {
            smallestIndex = i;
        }
    }

    const Lit smallest = cls[smallestIndex];

    CRef ref = CRef_Undef;
    size_t i = 0;
    for (; i < occ[toInt(smallest)].size(); ++i) {
        const Clause &c = ca[occ[toInt(smallest)][i]];
        if (c.size() != cls.size()) {
            continue;
        } // do not check this clause!

        int hit = 0;
        for (; hit < c.size(); ++hit) {
            if (!ma.isCurrentStep(toInt(c[hit]))) {
                break;
            } // a literal is not in both clauses, not the correct clause
        }
        if (hit < c.size()) {
            continue;
        } // not the right clause -> check next!

        ref = occ[toInt(smallest)][i];
        // remove from this occ-list
        occ[toInt(smallest)][i] = occ[toInt(smallest)][occ[toInt(smallest)].size() - 1];
        occ[toInt(smallest)].pop_back();
        i = ~0; // set to indicate that we found the clause
        break;
    }
    if (i == occ[toInt(smallest)].size() || ref == CRef_Undef) {
        if (verbose > 1) {
            std::cerr << "c [DRAT-OTFC] could not remove clause " << cls << " from list of literal " << smallest << std::endl;
        }
        printState();
        assert(false && "clause should be in the data structures");
        return false;
    }

    // remove from the other occ-lists!
    for (int i = 0; i < cls.size(); ++i) {
        if (i == smallestIndex) {
            continue;
        }
        std::vector<CRef> &list = occ[toInt(cls[i])];
        size_t j = 0;
        for (; j < list.size(); ++j) {
            if (list[j] == ref) {
                list[j] = list[list.size() - 1];
                list.pop_back(); // remove the element
                j = -1;          // point somewhere invalid
                break;
            }
        }
        if (j == list.size()) {
            if (verbose > 1) {
                std::cerr << "c could not remove clause " << cls << " from list of literal " << cls[i] << std::endl;
            }
            printState();
            if (verbose > 2) {
                std::cerr << "c list for " << cls[i] << " : ";
                for (size_t k = 0; k < list.size(); ++k) {
                    std::cerr << "c " << ca[list[k]] << std::endl;
                }
            }
            assert(false && "should be able to remove the clause from all lists");
        }
    }

    // remove the clause from the two watched literal structures!
    detachClause(ref);

    // tell the garbage-collection-system that the clause can be removed
    ca[ref].mark(1);
    ca.free(ref);

    if (verbose > 1) {
        std::cerr << "c [DRAT-OTFC] removed clause " << cls << " which is internally " << ca[ref] << std::endl;
    }
    // check garbage collection once in a while!
    // TODO
    return true;
}